

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O0

void cppurses::detail::Screen::full_paint(Widget *widg,Screen_descriptor *staged_tiles)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  Point local_58;
  ulong local_48;
  size_t x;
  size_t y;
  size_t x_end;
  size_t y_end;
  size_t x_begin;
  size_t y_begin;
  Screen_descriptor *staged_tiles_local;
  Widget *widg_local;
  
  y_begin = (size_t)staged_tiles;
  staged_tiles_local = (Screen_descriptor *)widg;
  paint_empty_tiles(widg);
  x_begin = Widget::y((Widget *)staged_tiles_local);
  y_end = Widget::x((Widget *)staged_tiles_local);
  sVar3 = x_begin;
  sVar2 = Widget::outer_height((Widget *)staged_tiles_local);
  sVar1 = y_end;
  x_end = sVar3 + sVar2;
  sVar3 = Widget::outer_width((Widget *)staged_tiles_local);
  y = sVar1 + sVar3;
  for (x = x_begin; x < x_end; x = x + 1) {
    for (local_48 = y_end; local_48 < y; local_48 = local_48 + 1) {
      local_58.x = local_48;
      local_58.y = x;
      full_paint_single_point((Widget *)staged_tiles_local,(Screen_descriptor *)y_begin,&local_58);
    }
  }
  return;
}

Assistant:

void Screen::full_paint(Widget& widg, const Screen_descriptor& staged_tiles)
{
    paint_empty_tiles(widg);
    const auto y_begin = widg.y();
    const auto x_begin = widg.x();
    const auto y_end   = y_begin + widg.outer_height();
    const auto x_end   = x_begin + widg.outer_width();
    for (auto y = y_begin; y < y_end; ++y) {
        for (auto x = x_begin; x < x_end; ++x) {
            full_paint_single_point(widg, staged_tiles, Point{x, y});
        }
    }
}